

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O1

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int iVar3;
  uv_timer_t *req;
  sockaddr_in addr;
  uv_connect_t connect_req;
  sockaddr_in local_80;
  
  puVar2 = uv_default_loop();
  req = (uv_timer_t *)0x199cc9;
  iVar3 = 0x23a3;
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,&local_80);
  if (iVar1 == 0) {
    iVar3 = 0x335dc0;
    req = (uv_timer_t *)puVar2;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    if (iVar1 != 0) goto LAB_0016eaff;
    iVar3 = 0x335dc0;
    req = (uv_timer_t *)&stack0xffffffffffffff90;
    iVar1 = uv_tcp_connect((uv_connect_t *)req,&tcp_handle,(sockaddr *)&local_80,connect_cb);
    if (iVar1 != 0) {
      if (iVar1 == -0x65) {
LAB_0016eaee:
        run_test_tcp_close_while_connecting_cold_12();
        return 1;
      }
      goto LAB_0016eb04;
    }
    iVar3 = 0x335eb8;
    req = (uv_timer_t *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer1_handle);
    if (iVar1 != 0) goto LAB_0016eb09;
    req = &timer1_handle;
    iVar3 = 0x16eb67;
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    if (iVar1 != 0) goto LAB_0016eb0e;
    iVar3 = 0x335f50;
    req = (uv_timer_t *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer2_handle);
    if (iVar1 != 0) goto LAB_0016eb13;
    req = &timer2_handle;
    iVar3 = 0x16eb8e;
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    if (iVar1 != 0) goto LAB_0016eb18;
    iVar3 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016eb1d;
    if (connect_cb_called != 1) goto LAB_0016eb22;
    if (timer1_cb_called != 1) goto LAB_0016eb27;
    if (close_cb_called == 2) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        if (netunreach_errors < 1) {
          return 0;
        }
        goto LAB_0016eaee;
      }
      goto LAB_0016eb31;
    }
  }
  else {
    run_test_tcp_close_while_connecting_cold_1();
LAB_0016eaff:
    run_test_tcp_close_while_connecting_cold_2();
LAB_0016eb04:
    run_test_tcp_close_while_connecting_cold_13();
LAB_0016eb09:
    run_test_tcp_close_while_connecting_cold_3();
LAB_0016eb0e:
    run_test_tcp_close_while_connecting_cold_4();
LAB_0016eb13:
    run_test_tcp_close_while_connecting_cold_5();
LAB_0016eb18:
    puVar2 = (uv_loop_t *)req;
    run_test_tcp_close_while_connecting_cold_6();
LAB_0016eb1d:
    run_test_tcp_close_while_connecting_cold_7();
LAB_0016eb22:
    run_test_tcp_close_while_connecting_cold_8();
LAB_0016eb27:
    run_test_tcp_close_while_connecting_cold_9();
  }
  run_test_tcp_close_while_connecting_cold_10();
LAB_0016eb31:
  run_test_tcp_close_while_connecting_cold_11();
  if ((iVar3 != -0x7d) && (iVar3 != -0x65)) {
    connect_cb_cold_1();
    uv_close((uv_handle_t *)puVar2,close_cb);
    uv_close((uv_handle_t *)&tcp_handle,close_cb);
    timer1_cb_called = timer1_cb_called + 1;
    return extraout_EAX;
  }
  iVar1 = uv_timer_stop(&timer2_handle);
  connect_cb_called = connect_cb_called + 1;
  if (iVar3 == -0x65) {
    netunreach_errors = netunreach_errors + 1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT(r == 0);
  ASSERT(0 == uv_timer_init(loop, &timer1_handle));
  ASSERT(0 == uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT(0 == uv_timer_init(loop, &timer2_handle));
  ASSERT(0 == uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(timer1_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}